

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O2

int dlep_reader_int64(int64_t *number,uint16_t tlv_id,dlep_session *session,dlep_parser_value *value
                     )

{
  ulong uVar1;
  
  if ((value == (dlep_parser_value *)0x0) &&
     (value = dlep_session_get_tlv_value(session,tlv_id), value == (dlep_parser_value *)0x0)) {
    return -1;
  }
  uVar1 = *(ulong *)((session->parser).tlv_ptr + value->index);
  *number = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
            (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
            (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  return 0;
}

Assistant:

int
dlep_reader_int64(int64_t *number, uint16_t tlv_id, struct dlep_session *session, struct dlep_parser_value *value) {
  uint64_t tmp;
  const uint8_t *ptr;

  if (!value) {
    value = dlep_session_get_tlv_value(session, tlv_id);
    if (!value) {
      return -1;
    }
  }

  ptr = dlep_session_get_tlv_binary(session, value);
  memcpy(&tmp, ptr, sizeof(tmp));
  *number = (int64_t)(be64toh(tmp));
  return 0;
}